

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f Quat4f::slerp(Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  undefined8 uVar1;
  bool bVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar10 [16];
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float fVar13;
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Quat4f QVar18;
  undefined1 extraout_var [56];
  
  auVar11._4_60_ = in_register_00001204;
  auVar11._0_4_ = t;
  auVar15 = *(undefined1 (*) [16])b->m_elements;
  auVar16 = *(undefined1 (*) [16])CONCAT71(in_register_00000011,allowFlip);
  auVar10._0_4_ = auVar15._0_4_ * auVar16._0_4_;
  auVar10._4_4_ = auVar15._4_4_ * auVar16._4_4_;
  auVar10._8_4_ = auVar15._8_4_ * auVar16._8_4_;
  auVar10._12_4_ = auVar15._12_4_ * auVar16._12_4_;
  auVar10 = vmovshdup_avx(auVar10);
  auVar10 = vfmadd231ss_fma(auVar10,auVar15,auVar16);
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)b->m_elements[2]),auVar10,
                            ZEXT416(*(uint *)(CONCAT71(in_register_00000011,allowFlip) + 8)));
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)b->m_elements[3]),auVar10,
                            ZEXT416(*(uint *)(CONCAT71(in_register_00000011,allowFlip) + 0xc)));
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(auVar10,auVar4);
  if (0.009999999776482582 <= 1.0 - (double)auVar4._0_4_) {
    dVar8 = acos((double)auVar4._0_4_);
    fVar6 = (float)dVar8;
    dVar8 = sin((double)fVar6);
    dVar9 = sin((double)((1.0 - t) * fVar6));
    auVar12._0_8_ = sin((double)(fVar6 * t));
    auVar12._8_56_ = extraout_var;
    auVar15._8_8_ = extraout_XMM0_Qb;
    auVar15._0_8_ = dVar9;
    auVar15 = vunpcklpd_avx(auVar12._0_16_,auVar15);
    auVar14._8_8_ = (double)(float)dVar8;
    auVar14._0_8_ = (double)(float)dVar8;
    auVar16 = *(undefined1 (*) [16])CONCAT71(in_register_00000011,allowFlip);
    auVar4 = vdivpd_avx(auVar15,auVar14);
    auVar15 = *(undefined1 (*) [16])b->m_elements;
    auVar4 = vcvtpd2ps_avx(auVar4);
  }
  else {
    auVar4 = vinsertps_avx(auVar11._0_16_,ZEXT416((uint)(1.0 - t)),0x10);
  }
  auVar14 = vmovshdup_avx(auVar4);
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(auVar14,auVar5);
  uVar1 = vcmpss_avx512f(auVar10,ZEXT816(0) << 0x40,1);
  bVar2 = (bool)((byte)uVar1 & 1);
  iVar3 = (uint)bVar2 *
          ((uint)(in_CL & 1) * auVar5._0_4_ + (uint)!(bool)(in_CL & 1) * auVar14._0_4_) +
          (uint)!bVar2 * auVar14._0_4_;
  fVar6 = auVar4._0_4_;
  fVar7 = fVar6 * auVar16._0_4_;
  fVar13 = fVar6 * auVar16._4_4_;
  auVar17._4_4_ = iVar3;
  auVar17._0_4_ = iVar3;
  auVar17._8_4_ = iVar3;
  auVar17._12_4_ = iVar3;
  auVar16 = vfmadd213ps_fma(auVar17,auVar15,
                            CONCAT412(fVar6 * auVar16._12_4_,
                                      CONCAT48(fVar6 * auVar16._8_4_,CONCAT44(fVar13,fVar7))));
  *(undefined1 (*) [16])a->m_elements = auVar16;
  QVar18.m_elements._8_8_ = auVar15._0_8_;
  QVar18.m_elements[0] = fVar7;
  QVar18.m_elements[1] = fVar13;
  return (Quat4f)QVar18.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}